

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

void flatcc_emitter_clear(flatcc_emitter_t *E)

{
  flatcc_emitter_page_t *local_18;
  flatcc_emitter_page_t *p;
  flatcc_emitter_t *E_local;
  
  local_18 = E->front;
  if (local_18 != (flatcc_emitter_page_t *)0x0) {
    local_18->prev->next = (flatcc_emitter_page_t *)0x0;
    while (local_18->next != (flatcc_emitter_page_t *)0x0) {
      local_18 = local_18->next;
      free(local_18->prev);
    }
    free(local_18);
    memset(E,0,0x48);
  }
  return;
}

Assistant:

void flatcc_emitter_clear(flatcc_emitter_t *E)
{
    flatcc_emitter_page_t *p = E->front;

    if (!p) {
        return;
    }
    p->prev->next = 0;
    while (p->next) {
        p = p->next;
        FLATCC_EMITTER_FREE(p->prev);
    }
    FLATCC_EMITTER_FREE(p);
    memset(E, 0, sizeof(*E));
}